

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int ltf8_decode(cram_fd *fd,int64_t *val_p)

{
  hFILE *phVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  phVar1 = fd->fp;
  pbVar2 = (byte *)phVar1->begin;
  if (pbVar2 < phVar1->end) {
    phVar1->begin = (char *)(pbVar2 + 1);
    uVar6 = (uint)*pbVar2;
  }
  else {
    uVar6 = hgetc2(phVar1);
  }
  if (uVar6 == 0xffffffff) {
    iVar3 = -1;
  }
  else {
    uVar11 = uVar6 & 0xff;
    uVar12 = (ulong)uVar11;
    iVar3 = 1;
    if (0x7f < uVar11) {
      if (uVar11 < 0xc0) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar11 = (uint)*pbVar2;
        }
        else {
          uVar11 = hgetc2(phVar1);
        }
        uVar12 = (ulong)((uVar6 & 0x3f) << 8 | uVar11 & 0xff);
        iVar3 = 2;
      }
      else if (uVar11 < 0xe0) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar11 = (uint)*pbVar2;
        }
        else {
          uVar11 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = hgetc2(phVar1);
        }
        uVar12 = (ulong)((uVar6 & 0x1f) << 0x10 | (uVar11 & 0xff) << 8 | uVar4 & 0xff);
        iVar3 = 3;
      }
      else if (uVar11 < 0xf0) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar11 = (uint)*pbVar2;
        }
        else {
          uVar11 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar5 = (uint)*pbVar2;
        }
        else {
          uVar5 = hgetc2(phVar1);
        }
        uVar12 = (ulong)(((uVar11 & 0xff) << 8 | (uVar6 & 0xf) << 0x10 | uVar4 & 0xff) << 8 |
                        uVar5 & 0xff);
        iVar3 = 4;
      }
      else if (uVar11 < 0xf8) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar6 = (uint)*pbVar2;
        }
        else {
          uVar6 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar5 = (uint)*pbVar2;
        }
        else {
          uVar5 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar7 = (uint)*pbVar2;
        }
        else {
          uVar7 = hgetc2(phVar1);
        }
        uVar12 = ((ulong)((uVar6 & 0xff) << 8 | uVar11 << 0x10 | uVar4 & 0xff) & 0x7ffff) << 0x10 |
                 (ulong)((uVar5 & 0xff) << 8) | (ulong)(uVar7 & 0xff);
        iVar3 = 5;
      }
      else if (uVar11 < 0xfc) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar6 = (uint)*pbVar2;
        }
        else {
          uVar6 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar5 = (uint)*pbVar2;
        }
        else {
          uVar5 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar7 = (uint)*pbVar2;
        }
        else {
          uVar7 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar8 = (uint)*pbVar2;
        }
        else {
          uVar8 = hgetc2(phVar1);
        }
        uVar12 = ((ulong)((uVar5 & 0xff) << 8) |
                  ((ulong)((uVar6 & 0xff) << 8 | uVar11 << 0x10 | uVar4 & 0xff) & 0x3ffff) << 0x10 |
                 (ulong)(uVar7 & 0xff)) << 8 | (ulong)(uVar8 & 0xff);
        iVar3 = 6;
      }
      else if (uVar11 < 0xfe) {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar6 = (uint)*pbVar2;
        }
        else {
          uVar6 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        else {
          uVar4 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar5 = (uint)*pbVar2;
        }
        else {
          uVar5 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar7 = (uint)*pbVar2;
        }
        else {
          uVar7 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar8 = (uint)*pbVar2;
        }
        else {
          uVar8 = hgetc2(phVar1);
        }
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (pbVar2 < phVar1->end) {
          phVar1->begin = (char *)(pbVar2 + 1);
          uVar9 = (uint)*pbVar2;
        }
        else {
          uVar9 = hgetc2(phVar1);
        }
        uVar12 = ((ulong)((uVar5 & 0xff) << 8) |
                  ((ulong)((uVar6 & 0xff) << 8 | uVar11 << 0x10 | uVar4 & 0xff) & 0x1ffff) << 0x10 |
                 (ulong)(uVar7 & 0xff)) << 0x10 | (ulong)((uVar8 & 0xff) << 8) |
                 (ulong)(uVar9 & 0xff);
        iVar3 = 7;
      }
      else {
        phVar1 = fd->fp;
        pbVar2 = (byte *)phVar1->begin;
        if (uVar11 == 0xff) {
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar6 = (uint)*pbVar2;
          }
          else {
            uVar6 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar11 = (uint)*pbVar2;
          }
          else {
            uVar11 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar4 = (uint)*pbVar2;
          }
          else {
            uVar4 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar5 = (uint)*pbVar2;
          }
          else {
            uVar5 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar7 = (uint)*pbVar2;
          }
          else {
            uVar7 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar8 = (uint)*pbVar2;
          }
          else {
            uVar8 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar9 = (uint)*pbVar2;
          }
          else {
            uVar9 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar10 = (uint)*pbVar2;
          }
          else {
            uVar10 = hgetc2(phVar1);
          }
          uVar12 = ((ulong)((uVar8 & 0xff) << 8) |
                    ((ulong)((uVar5 & 0xff) << 8) |
                     (ulong)(uVar4 & 0xff | (uVar11 & 0xff) << 8 | uVar6 << 0x10) << 0x10 |
                    (ulong)(uVar7 & 0xff)) << 0x10 | (ulong)(uVar9 & 0xff)) << 8 |
                   (ulong)(uVar10 & 0xff);
          iVar3 = 9;
        }
        else {
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar6 = (uint)*pbVar2;
          }
          else {
            uVar6 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar11 = (uint)*pbVar2;
          }
          else {
            uVar11 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar4 = (uint)*pbVar2;
          }
          else {
            uVar4 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar5 = (uint)*pbVar2;
          }
          else {
            uVar5 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar7 = (uint)*pbVar2;
          }
          else {
            uVar7 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar8 = (uint)*pbVar2;
          }
          else {
            uVar8 = hgetc2(phVar1);
          }
          phVar1 = fd->fp;
          pbVar2 = (byte *)phVar1->begin;
          if (pbVar2 < phVar1->end) {
            phVar1->begin = (char *)(pbVar2 + 1);
            uVar9 = (uint)*pbVar2;
          }
          else {
            uVar9 = hgetc2(phVar1);
          }
          uVar12 = ((ulong)((uVar5 & 0xff) << 8) |
                    (ulong)(uVar4 & 0xff | (uVar11 & 0xff | (uVar6 & 0xff) << 8) << 8) << 0x10 |
                   (ulong)(uVar7 & 0xff)) << 0x10 | (ulong)((uVar8 & 0xff) << 8) |
                   (ulong)(uVar9 & 0xff);
          iVar3 = 8;
        }
      }
    }
    *val_p = uVar12;
  }
  return iVar3;
}

Assistant:

int ltf8_decode(cram_fd *fd, int64_t *val_p) {
    int c = hgetc(fd->fp);
    int64_t val = (unsigned char)c;
    if (c == -1)
	return -1;

    if (val < 0x80) {
	*val_p =   val;
	return 1;

    } else if (val < 0xc0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & (((1LL<<(6+8)))-1);
	return 2;

    } else if (val < 0xe0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(5+2*8))-1);
	return 3;

    } else if (val < 0xf0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(4+3*8))-1);
	return 4;

    } else if (val < 0xf8) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(3+4*8))-1);
	return 5;

    } else if (val < 0xfc) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(2+5*8))-1);
	return 6;

    } else if (val < 0xfe) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(1+6*8))-1);
	return 7;

    } else if (val < 0xff) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(7*8))-1);
	return 8;

    } else {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
    }

    return 9;
}